

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error string_append_char(char **destination,char append)

{
  size_t sVar1;
  char *pcVar2;
  char *tmp;
  size_t destination_size;
  char append_local;
  char **destination_local;
  
  sVar1 = strlen(*destination);
  pcVar2 = (char *)realloc(*destination,sVar1 + 2);
  if (pcVar2 == (char *)0x0) {
    free(*destination);
    destination_local._4_4_ = MEMORY_ALLOCATION_ERROR;
  }
  else {
    *destination = pcVar2;
    (*destination)[sVar1] = append;
    (*destination)[sVar1 + 1] = '\0';
    destination_local._4_4_ = NO_ERROR;
  }
  return destination_local._4_4_;
}

Assistant:

natwm_error string_append_char(char **destination, char append)
{
        size_t destination_size = strlen(*destination);
        char *tmp = realloc(*destination, destination_size + 2);

        if (tmp == NULL) {
                free(*destination);

                return MEMORY_ALLOCATION_ERROR;
        }

        *destination = tmp;

        (*destination)[destination_size] = append;
        (*destination)[destination_size + 1] = '\0';

        return NO_ERROR;
}